

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::load_next_row(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  coeff_buf *pcVar4;
  uint8 *puVar5;
  jpgd_block_t *pjVar6;
  jpgd_quant_t *pjVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  int mcu_row;
  int iVar16;
  int iVar17;
  long lVar18;
  int block_x_mcu [4];
  int local_58;
  int local_48 [6];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (0 < this->m_mcus_per_row) {
    mcu_row = 0;
    do {
      if (0 < this->m_blocks_per_mcu) {
        lVar18 = 0;
        local_58 = 0;
        iVar11 = 0;
        do {
          iVar1 = this->m_mcu_org[lVar18];
          pcVar3 = this->m_dc_coeffs[iVar1];
          pcVar4 = this->m_ac_coeffs[iVar1];
          iVar10 = local_48[iVar1];
          iVar16 = this->m_block_y_mcu[iVar1] + local_58;
          iVar17 = pcVar4->block_size;
          puVar5 = pcVar4->pData;
          iVar2 = pcVar4->block_num_x;
          pjVar6 = this->m_pMCU_coefficients;
          pjVar7 = this->m_quant[this->m_comp_quant[iVar1]];
          pjVar6[lVar18 * 0x40] =
               *(jpgd_block_t *)
                (pcVar3->pData +
                (long)(iVar16 * pcVar3->block_size * pcVar3->block_num_x) +
                (long)((iVar10 + iVar11) * pcVar3->block_size));
          memcpy(pjVar6 + lVar18 * 0x40 + 1,
                 puVar5 + (long)(iVar17 * iVar16 * iVar2) + (long)(iVar17 * (iVar10 + iVar11)) + 2,
                 0x7e);
          uVar9 = 0x40;
          do {
            uVar14 = uVar9 - 1;
            if (pjVar6[lVar18 * 0x40 + (long)(int)(&g_ZAG)[uVar14]] != 0) {
              this->m_mcu_block_max_zag[lVar18] = uVar9;
              uVar9 = uVar9 - 1;
              if ((int)uVar9 < 0) goto LAB_00120cef;
              goto LAB_00120cc4;
            }
            uVar9 = uVar14;
          } while (1 < uVar14);
          this->m_mcu_block_max_zag[lVar18] = 1;
          uVar9 = 0;
LAB_00120cc4:
          piVar15 = &g_ZAG + uVar9;
          lVar12 = (ulong)uVar9 + 1;
          do {
            if (pjVar6[lVar18 * 0x40 + (long)*piVar15] != 0) {
              pjVar6[lVar18 * 0x40 + (long)*piVar15] =
                   pjVar6[lVar18 * 0x40 + (long)*piVar15] * pjVar7[lVar12 + -1];
            }
            piVar15 = piVar15 + -1;
            lVar13 = lVar12 + -1;
            bVar8 = 0 < lVar12;
            lVar12 = lVar13;
          } while (lVar13 != 0 && bVar8);
LAB_00120cef:
          if (this->m_comps_in_scan == 1) {
            iVar10 = iVar10 + 1;
LAB_00120cff:
            local_48[iVar1] = iVar10;
          }
          else {
            iVar17 = iVar11 + 1;
            iVar11 = iVar17;
            if (iVar17 == this->m_comp_h_samp[iVar1]) {
              local_58 = local_58 + 1;
              iVar11 = 0;
              if (local_58 == this->m_comp_v_samp[iVar1]) {
                iVar10 = iVar17 + iVar10;
                local_58 = 0;
                iVar11 = 0;
                goto LAB_00120cff;
              }
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < this->m_blocks_per_mcu);
      }
      if (this->m_freq_domain_chroma_upsample == true) {
        transform_mcu_expand(this,mcu_row);
      }
      else {
        transform_mcu(this,mcu_row);
      }
      mcu_row = mcu_row + 1;
    } while (mcu_row < this->m_mcus_per_row);
  }
  if (this->m_comps_in_scan == 1) {
    this->m_block_y_mcu[this->m_comp_list[0]] = this->m_block_y_mcu[this->m_comp_list[0]] + 1;
  }
  else if (0 < this->m_comps_in_scan) {
    lVar18 = 0;
    do {
      this->m_block_y_mcu[this->m_comp_list[lVar18]] =
           this->m_block_y_mcu[this->m_comp_list[lVar18]] +
           this->m_comp_v_samp[this->m_comp_list[lVar18]];
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->m_comps_in_scan);
  }
  return;
}

Assistant:

void jpeg_decoder::load_next_row() {
  int i;
  jpgd_block_t* p;
  jpgd_quant_t* q;
  int mcu_row, mcu_block = 0;
  int component_num, component_id;
  int block_x_mcu[JPGD_MAX_COMPONENTS];

  memset(block_x_mcu, 0, JPGD_MAX_COMPONENTS * sizeof(int));

  for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

    for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++) {
      component_id = m_mcu_org[mcu_block];
      q = m_quant[m_comp_quant[component_id]];

      p = m_pMCU_coefficients + 64 * mcu_block;

      jpgd_block_t* pAC = coeff_buf_getp(m_ac_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      jpgd_block_t* pDC = coeff_buf_getp(m_dc_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      p[0] = pDC[0];
      memcpy(&p[1], &pAC[1], 63 * sizeof(jpgd_block_t));

      for (i = 63; i > 0; i--)
        if (p[g_ZAG[i]])
          break;

      m_mcu_block_max_zag[mcu_block] = i + 1;

      for (; i >= 0; i--)
        if (p[g_ZAG[i]])
          p[g_ZAG[i]] = static_cast<jpgd_block_t>(p[g_ZAG[i]] * q[i]);

      if (m_comps_in_scan == 1)
        block_x_mcu[component_id]++;
      else {
        if (++block_x_mcu_ofs == m_comp_h_samp[component_id]) {
          block_x_mcu_ofs = 0;

          if (++block_y_mcu_ofs == m_comp_v_samp[component_id]) {
            block_y_mcu_ofs = 0;

            block_x_mcu[component_id] += m_comp_h_samp[component_id];
          }
        }
      }
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);
  }

  if (m_comps_in_scan == 1)
    m_block_y_mcu[m_comp_list[0]]++;
  else {
    for (component_num = 0; component_num < m_comps_in_scan; component_num++) {
      component_id = m_comp_list[component_num];

      m_block_y_mcu[component_id] += m_comp_v_samp[component_id];
    }
  }
}